

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentsHelper.cxx
# Opt level: O2

void __thiscall
cmCommandArgument::FollowsGroup(cmCommandArgument *this,cmCommandArgumentGroup *group)

{
  if (group != (cmCommandArgumentGroup *)0x0) {
    this->ArgumentsBeforeEmpty = false;
    std::
    _Rb_tree<cmCommandArgument_const*,cmCommandArgument_const*,std::_Identity<cmCommandArgument_const*>,std::less<cmCommandArgument_const*>,std::allocator<cmCommandArgument_const*>>
    ::
    _M_insert_range_unique<__gnu_cxx::__normal_iterator<cmCommandArgument*const*,std::vector<cmCommandArgument*,std::allocator<cmCommandArgument*>>>>
              ((_Rb_tree<cmCommandArgument_const*,cmCommandArgument_const*,std::_Identity<cmCommandArgument_const*>,std::less<cmCommandArgument_const*>,std::allocator<cmCommandArgument_const*>>
                *)&this->ArgumentsBefore,
               (__normal_iterator<cmCommandArgument_*const_*,_std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>_>
                )(group->ContainedArguments).
                 super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<cmCommandArgument_*const_*,_std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>_>
                )(group->ContainedArguments).
                 super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    return;
  }
  return;
}

Assistant:

void cmCommandArgument::FollowsGroup(const cmCommandArgumentGroup* group)
{
  if (group != nullptr) {
    this->ArgumentsBeforeEmpty = false;
    this->ArgumentsBefore.insert(group->ContainedArguments.begin(),
                                 group->ContainedArguments.end());
  }
}